

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlTextWriterWriteDocCallback(void *context,char *str,int len)

{
  int val;
  int rc;
  xmlParserCtxtPtr ctxt;
  int len_local;
  char *str_local;
  void *context_local;
  
  val = xmlParseChunk((xmlParserCtxtPtr)context,str,len,0);
  context_local._4_4_ = len;
  if (val != 0) {
    xmlWriterErrMsgInt((xmlTextWriterPtr)0x0,XML_ERR_INTERNAL_ERROR,
                       "xmlTextWriterWriteDocCallback : XML error %d !\n",val);
    context_local._4_4_ = -1;
  }
  return context_local._4_4_;
}

Assistant:

static int
xmlTextWriterWriteDocCallback(void *context, const char *str, int len)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) context;
    int rc;

    if ((rc = xmlParseChunk(ctxt, str, len, 0)) != 0) {
        xmlWriterErrMsgInt(NULL, XML_ERR_INTERNAL_ERROR,
                        "xmlTextWriterWriteDocCallback : XML error %d !\n",
                        rc);
        return -1;
    }

    return len;
}